

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

double __thiscall Table::get_max(Table *this,int col)

{
  int iVar1;
  pointer ppVar2;
  double *pdVar3;
  double *i;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  i = (double *)(long)col;
  ppVar2 = (this->float_cols).
           super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = *(int *)&(this->columns).
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)i].
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                   .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
  pdVar4 = *(double **)
            &ppVar2[iVar1].second.super__Vector_base<double,_std::allocator<double>_>._M_impl;
  pdVar3 = *(pointer *)
            ((long)&ppVar2[iVar1].second.super__Vector_base<double,_std::allocator<double>_>._M_impl
            + 8);
  if (pdVar4 != pdVar3) {
    dVar6 = 0.0;
    do {
      dVar5 = *pdVar4;
      if (*pdVar4 <= dVar6) {
        dVar5 = dVar6;
      }
      pdVar4 = pdVar4 + 1;
      dVar6 = dVar5;
    } while (pdVar4 != pdVar3);
    return dVar5;
  }
  return 0.0;
}

Assistant:

double Table::get_max(int col){
    double ans = 0;
    for (double& i:float_cols[std::get<2>(columns[col])].second)
        ans = std::max(ans, i);
    return ans;
}